

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O2

Point3f __thiscall
ary::unprojectPoint(ary *this,Point2f *p,Matx33f *rotation,Matx31f *translation,Matx33f *intrinsics,
                   Mat *distortion)

{
  float fVar1;
  _InputArray *p_Var2;
  float *pfVar3;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  float fVar4;
  Point3f PVar5;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> ptsOut;
  Mat LOS;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> ptsIn;
  Mat intrInv;
  Mat translationInv;
  Mat rotationInv;
  undefined1 local_350 [16];
  Size local_340;
  Mat local_1f0;
  undefined1 local_190 [16];
  Size local_180;
  
  ptsIn.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ptsIn.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ptsIn.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ptsOut.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ptsOut.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ptsOut.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::push_back(&ptsIn,p);
  local_340.width = 0;
  local_340.height = 0;
  local_350._0_4_ = -2.4060936e-38;
  local_180.width = 0;
  local_180.height = 0;
  local_190._0_4_ = -0x7dfcfff3;
  local_190._8_8_ = &ptsOut;
  LOS.flags = -0x3efdfffb;
  intrInv.data = (uchar *)0x0;
  LOS.data = (uchar *)0x300000003;
  intrInv.flags = 0x1010000;
  LOS._8_8_ = intrinsics;
  intrInv._8_8_ = distortion;
  local_350._8_8_ = &ptsIn;
  p_Var2 = (_InputArray *)cv::noArray();
  rotationInv.flags = -0x3efdfffb;
  rotationInv.data = (uchar *)0x300000003;
  rotationInv._8_8_ = intrinsics;
  cv::undistortPoints((_InputArray *)local_350,(_OutputArray *)local_190,(_InputArray *)&LOS,
                      (_InputArray *)&intrInv,p_Var2,(_InputArray *)&rotationInv);
  cv::Mat::Mat(&LOS,3,1,5);
  fVar1 = (ptsOut.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
           .super__Vector_impl_data._M_start)->x;
  pfVar3 = cv::Mat::at<float>(&LOS,0);
  *pfVar3 = fVar1;
  fVar1 = (ptsOut.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
           .super__Vector_impl_data._M_start)->y;
  pfVar3 = cv::Mat::at<float>(&LOS,1);
  *pfVar3 = fVar1;
  pfVar3 = cv::Mat::at<float>(&LOS,2);
  *pfVar3 = 1.0;
  cv::Matx<float,_3,_3>::inv((Matx<float,_3,_3> *)local_350,intrinsics,0,(bool *)0x0);
  cv::Mat::Mat<float,3,3>(&intrInv,(Matx<float,_3,_3> *)local_350,true);
  cv::operator*((Mat *)local_350,&intrInv);
  (**(code **)(*(long *)CONCAT44(local_350._4_4_,local_350._0_4_) + 0x18))
            ((long *)CONCAT44(local_350._4_4_,local_350._0_4_),local_350,&LOS,0xffffffffffffffff);
  cv::MatExpr::~MatExpr((MatExpr *)local_350);
  cv::Matx<float,_3,_3>::t((Matx<float,_3,_3> *)local_350,rotation);
  cv::Mat::Mat<float,3,3>(&rotationInv,(Matx<float,_3,_3> *)local_350,true);
  cv::operator-((cv *)local_190,&rotationInv);
  cv::Mat::Mat<float,3,1>(&local_1f0,translation,true);
  cv::operator*((MatExpr *)local_350,(Mat *)local_190);
  cv::MatExpr::operator_cast_to_Mat(&translationInv,(MatExpr *)local_350);
  cv::MatExpr::~MatExpr((MatExpr *)local_350);
  cv::Mat::~Mat(&local_1f0);
  cv::MatExpr::~MatExpr((MatExpr *)local_190);
  cv::operator*((Mat *)local_350,&rotationInv);
  (**(code **)(*(long *)CONCAT44(local_350._4_4_,local_350._0_4_) + 0x18))
            ((long *)CONCAT44(local_350._4_4_,local_350._0_4_),local_350,&LOS,0xffffffffffffffff);
  cv::MatExpr::~MatExpr((MatExpr *)local_350);
  pfVar3 = cv::Mat::at<float>(&translationInv,2);
  fVar1 = *pfVar3;
  pfVar3 = cv::Mat::at<float>(&LOS,2);
  local_340.width = 0;
  local_340.height = 0;
  local_350._0_4_ = 9.477423e-38;
  fVar4 = 0.0;
  local_350._8_8_ = &LOS;
  cv::Mat::convertTo((_OutputArray *)&LOS,(int)local_350,(double)(-fVar1 / *pfVar3),0.0);
  *(undefined8 *)this = 0;
  *(undefined4 *)(this + 8) = 0;
  pfVar3 = cv::Mat::at<float>(&LOS,0);
  fVar1 = *pfVar3;
  pfVar3 = cv::Mat::at<float>(&translationInv,0);
  *(float *)this = fVar1 + *pfVar3;
  pfVar3 = cv::Mat::at<float>(&LOS,1);
  fVar1 = *pfVar3;
  pfVar3 = cv::Mat::at<float>(&translationInv,1);
  *(float *)(this + 4) = fVar1 + *pfVar3;
  pfVar3 = cv::Mat::at<float>(&LOS,2);
  fVar1 = *pfVar3;
  pfVar3 = cv::Mat::at<float>(&translationInv,2);
  *(float *)(this + 8) = fVar1 + *pfVar3;
  cv::Mat::~Mat(&translationInv);
  cv::Mat::~Mat(&rotationInv);
  cv::Mat::~Mat(&intrInv);
  cv::Mat::~Mat(&LOS);
  std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
            (&ptsOut.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
  std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
            (&ptsIn.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
  PVar5.y = (float)extraout_XMM0_Db;
  PVar5.x = (float)extraout_XMM0_Da;
  PVar5.z = fVar4;
  return PVar5;
}

Assistant:

Point3f unprojectPoint(Point2f p, const Matx33f& rotation, const Matx31f& translation, const Matx33f& intrinsics, const Mat& distortion) {

	std::vector<Point2f> ptsIn, ptsOut;
    ptsIn.push_back(p);
    undistortPoints(ptsIn, ptsOut, intrinsics, distortion, noArray(), intrinsics);

    float x = ptsOut[0].x;
    float y = ptsOut[0].y;

    Mat LOS(3,1,CV_32F);

    LOS.at<float>(0) = ptsOut[0].x;
    LOS.at<float>(1) = ptsOut[0].y;
    LOS.at<float>(2) = 1;

	Mat intrInv = Mat(intrinsics.inv());
    LOS = intrInv * LOS;

    Mat rotationInv = Mat(rotation.t());
    Mat translationInv = (-rotationInv * Mat(translation));
	LOS = rotationInv * LOS;

	LOS *= -(translationInv.at<float>(2) / LOS.at<float>(2));
	Point3f r;

	r.x = LOS.at<float>(0) + translationInv.at<float>(0);
	r.y = LOS.at<float>(1) + translationInv.at<float>(1);
	r.z = LOS.at<float>(2) + translationInv.at<float>(2);

	return r;
}